

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weightedgraph.cpp
# Opt level: O2

UEdgeVec * libDAI::RandomDRegularGraph(UEdgeVec *__return_storage_ptr__,size_t N,size_t d)

{
  size_t *psVar1;
  pointer pUVar2;
  bool bVar3;
  pointer puVar4;
  pointer pUVar5;
  pointer puVar6;
  size_t sVar7;
  ulong uVar8;
  pointer puVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  vector<unsigned_long,_std::allocator<unsigned_long>_> U;
  vector<unsigned_long,_std::allocator<unsigned_long>_> degrees;
  value_type_conflict2 local_38;
  
  (__return_storage_ptr__->super__Vector_base<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    U.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    U.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    U.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&U,(size_type)(d * N));
    for (degrees.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start = (pointer)0x0;
        degrees.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start < (pointer)(d * N);
        degrees.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((long)degrees.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + 1)) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&U,(value_type_conflict2 *)&degrees);
    }
    pUVar5 = (__return_storage_ptr__->
             super__Vector_base<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((__return_storage_ptr__->super__Vector_base<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>).
        _M_impl.super__Vector_impl_data._M_finish != pUVar5) {
      (__return_storage_ptr__->super__Vector_base<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>).
      _M_impl.super__Vector_impl_data._M_finish = pUVar5;
    }
    bVar3 = false;
    while( true ) {
      if (bVar3) break;
      std::
      random_shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )U.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )U.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      lVar12 = -0x10;
      lVar14 = 0x10;
      bVar3 = false;
      puVar6 = U.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar9 = U.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = 0;
      while ((uVar10 < ((long)puVar6 - (long)puVar9 >> 3) - 1U && (!bVar3))) {
        uVar8 = uVar10 + 1;
        lVar11 = lVar12;
        lVar13 = lVar14;
        while ((uVar8 < (ulong)((long)puVar6 - (long)puVar9 >> 3) && (!bVar3))) {
          puVar4 = (pointer)(*(ulong *)((long)puVar9 + lVar13 + -8) / d);
          if ((pointer)(puVar9[uVar10] / d) != puVar4) {
            degrees.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)(puVar9[uVar10] / d);
            degrees.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = puVar4;
            std::vector<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>::emplace_back<libDAI::UEdge>
                      (__return_storage_ptr__,(UEdge *)&degrees);
            if ((pointer)((long)U.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar13) !=
                U.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              memmove((void *)((long)U.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar13 + -8),
                      (pointer)((long)U.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar13),
                      (long)U.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                      (lVar11 - (long)U.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start));
            }
            puVar6 = U.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar10 + 1;
            U.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 U.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
            if (puVar6 != U.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_finish) {
              memmove(U.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar10,puVar6,
                      (long)U.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar6);
            }
            puVar6 = U.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish + -1;
            bVar3 = true;
            puVar9 = U.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            U.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = puVar6;
          }
          uVar8 = uVar8 + 1;
          lVar13 = lVar13 + 8;
          lVar11 = lVar11 + -8;
        }
        lVar14 = lVar14 + 8;
        lVar12 = lVar12 + -8;
        uVar10 = uVar10 + 1;
      }
      bVar3 = (bool)(puVar9 == puVar6 | bVar3 ^ 1U);
    }
    if (U.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        U.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      degrees.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_38 = 0;
      degrees.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      degrees.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&degrees,N,&local_38);
      pUVar2 = (__return_storage_ptr__->
               super__Vector_base<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (pUVar5 = (__return_storage_ptr__->
                    super__Vector_base<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>)._M_impl.
                    super__Vector_impl_data._M_start; pUVar5 != pUVar2; pUVar5 = pUVar5 + 1) {
        degrees.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[pUVar5->n1] =
             degrees.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[pUVar5->n1] + 1;
        degrees.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[pUVar5->n2] =
             degrees.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[pUVar5->n2] + 1;
      }
      sVar7 = 0;
      do {
        if (N == sVar7) {
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    (&degrees.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    (&U.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
          return __return_storage_ptr__;
        }
        psVar1 = degrees.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start + sVar7;
        sVar7 = sVar7 + 1;
      } while (*psVar1 == d);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&degrees.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&U.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  } while( true );
}

Assistant:

UEdgeVec RandomDRegularGraph( size_t N, size_t d ) {
        // Algorithm 1 in "Generating random regular graphs quickly"
        // by A. Steger and N.C. Wormald
        //
        // Draws a random graph with size N and uniform degree d
        // from an almost uniform probability distribution over these graphs
        // (which becomes uniform in the limit that d is small and N goes
        // to infinity).
        
        assert( (N * d) % 2 == 0 );

        bool ready = false;
        UEdgeVec G;

        size_t tries = 0;
        while( !ready ) {
            tries++;

            // Start with N*d points {0,1,...,N*d-1} (N*d even) in N groups.
            // Put U = {0,1,...,N*d-1}. (U denotes the set of unpaired points.)
            vector<size_t> U;
            U.reserve( N * d );
            for( size_t i = 0; i < N * d; i++ )
                U.push_back( i );

            // Repeat the following until no suitable pair can be found: Choose
            // two random points i and j in U, and if they are suitable, pair
            // i with j and delete i and j from U.
            G.clear();
            bool finished = false;
            while( !finished ) {
                random_shuffle( U.begin(), U.end() );
                size_t i1, i2;
                bool suit_pair_found = false;
                for( i1 = 0; i1 < U.size()-1 && !suit_pair_found; i1++ )
                    for( i2 = i1+1; i2 < U.size() && !suit_pair_found; i2++ )
                        if( (U[i1] / d) != (U[i2] / d) ) {
                            // they are suitable
                            suit_pair_found = true;
                            G.push_back( UEdge( U[i1] / d, U[i2] / d ) );
                            U.erase( U.begin() + i2 );  // first remove largest
                            U.erase( U.begin() + i1 );  // remove smallest
                        }
                if( !suit_pair_found || U.empty() )
                    finished = true;
            }

            if( U.empty() ) {
                // G is a graph with edge from vertex r to vertex s if and only if
                // there is a pair containing points in the r'th and s'th groups.
                // If G is d-regular, output, otherwise return to Step 1.

                vector<size_t> degrees;
                degrees.resize( N, 0 );
                for( UEdgeVec::const_iterator e = G.begin(); e != G.end(); e++ ) {
                    degrees[e->n1]++;
                    degrees[e->n2]++;
                }
                ready = true;
                for( size_t n = 0; n < N; n++ )
                    if( degrees[n] != d ) {
                        ready = false;
                        break;
                    }
            } else
                ready = false;
        }

        return G;
    }